

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
* __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::writeImpl
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
           *__return_storage_ptr__,BlockedRead *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData)

{
  ulong uVar1;
  ulong __n;
  uchar *__src;
  ulong __n_00;
  uchar *__dest;
  ArrayPtr<const_unsigned_char> *pAVar2;
  size_t sVar3;
  bool bVar4;
  
  sVar3 = moreData.size_;
  pAVar2 = moreData.ptr;
  __n = data.size_;
  __src = data.ptr;
  __n_00 = (this->readBuffer).size_;
  if (__n < __n_00) {
    __dest = (this->readBuffer).ptr;
    do {
      memcpy(__dest,__src,__n);
      uVar1 = (this->readSoFar).byteCount + __n;
      (this->readSoFar).byteCount = uVar1;
      __dest = (this->readBuffer).ptr + __n;
      __n_00 = (this->readBuffer).size_ - __n;
      (this->readBuffer).ptr = __dest;
      (this->readBuffer).size_ = __n_00;
      bVar4 = sVar3 == 0;
      sVar3 = sVar3 - 1;
      if (bVar4) {
        if (this->minBytes <= uVar1) {
          (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])();
          if ((BlockedRead *)(this->pipe->state).ptr == this) {
            (this->pipe->state).ptr = (AsyncCapabilityStream *)0x0;
          }
        }
        goto LAB_0040e712;
      }
      __src = pAVar2->ptr;
      __n = pAVar2->size_;
      pAVar2 = pAVar2 + 1;
    } while (__n < __n_00);
  }
  else {
    uVar1 = (this->readSoFar).byteCount;
  }
  (this->readSoFar).byteCount = uVar1 + __n_00;
  (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])();
  if ((BlockedRead *)(this->pipe->state).ptr == this) {
    (this->pipe->state).ptr = (AsyncCapabilityStream *)0x0;
  }
  memcpy((this->readBuffer).ptr,__src,__n_00);
  if (__n == __n_00 && sVar3 == 0) {
LAB_0040e712:
    __return_storage_ptr__->tag = 1;
  }
  else {
    __return_storage_ptr__->tag = 2;
    *(uchar **)&__return_storage_ptr__->field_1 = __src + __n_00;
    *(ulong *)((long)&__return_storage_ptr__->field_1 + 8) = __n - __n_00;
    *(ArrayPtr<const_unsigned_char> **)((long)&__return_storage_ptr__->field_1 + 0x10) = pAVar2;
    *(size_t *)((long)&__return_storage_ptr__->field_1 + 0x18) = sVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

OneOf<Done, Retry> writeImpl(ArrayPtr<const byte> data,
                                 ArrayPtr<const ArrayPtr<const byte>> moreData) {
      for (;;) {
        if (data.size() < readBuffer.size()) {
          // First write segment consumes a portion of the read buffer but not all of it.
          auto n = data.size();
          memcpy(readBuffer.begin(), data.begin(), n);
          readSoFar.byteCount += n;
          readBuffer = readBuffer.slice(n, readBuffer.size());
          if (moreData.size() == 0) {
            // Consumed all written pieces.
            if (readSoFar.byteCount >= minBytes) {
              // We've read enough to close out this read.
              fulfiller.fulfill(kj::cp(readSoFar));
              pipe.endState(*this);
            }
            return Done();
          }
          data = moreData[0];
          moreData = moreData.slice(1, moreData.size());
          // loop
        } else {
          // First write segment consumes entire read buffer.
          auto n = readBuffer.size();
          readSoFar.byteCount += n;
          fulfiller.fulfill(kj::cp(readSoFar));
          pipe.endState(*this);
          memcpy(readBuffer.begin(), data.begin(), n);

          data = data.slice(n, data.size());
          if (data.size() == 0 && moreData.size() == 0) {
            return Done();
          } else {
            // Note: Even if `data` is empty, we don't replace it with moreData[0], because the
            //   retry might need to use write(ArrayPtr<ArrayPtr<byte>>) which doesn't allow
            //   passing a separate first segment.
            return Retry { data, moreData };
          }
        }
      }
    }